

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void yindex(LexState *ls,expdesc *v)

{
  expdesc *v_local;
  LexState *ls_local;
  
  luaX_next(ls);
  expr(ls,v);
  luaK_exp2val(ls->fs,v);
  checknext(ls,0x5d);
  return;
}

Assistant:

static void yindex(LexState*ls,expdesc*v){
luaX_next(ls);
expr(ls,v);
luaK_exp2val(ls->fs,v);
checknext(ls,']');
}